

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<kj::Promise<void>,capnp::LocalClient::BlockedCall>,kj::_::PromiseDisposer,capnp::LocalClient&>
          (PromiseDisposer *this,LocalClient *params)

{
  Maybe<capnp::LocalClient::BlockedCall_&> *pMVar1;
  void *pvVar2;
  
  pvVar2 = operator_new(0x400);
  *(undefined8 *)((long)pvVar2 + 0x208) = 0;
  *(undefined ***)((long)pvVar2 + 0x1f8) = &PTR_destroy_0037b530;
  *(undefined ***)((long)pvVar2 + 0x210) = &PTR_reject_0037b580;
  *(undefined1 *)((long)pvVar2 + 0x218) = 0;
  *(undefined1 *)((long)pvVar2 + 0x3b0) = 0;
  *(undefined1 *)((long)pvVar2 + 0x3c0) = 1;
  *(long *)((long)pvVar2 + 0x3c8) = (long)pvVar2 + 0x210;
  *(LocalClient **)((long)pvVar2 + 0x3d0) = params;
  *(undefined8 *)((long)pvVar2 + 1000) = 0;
  *(undefined8 *)((long)pvVar2 + 0x3f0) = 0;
  pMVar1 = params->blockedCallsEnd;
  *(Maybe<capnp::LocalClient::BlockedCall_&> **)((long)pvVar2 + 0x3f8) = pMVar1;
  pMVar1->ptr = (BlockedCall *)((long)pvVar2 + 0x3c8);
  params->blockedCallsEnd = (Maybe<capnp::LocalClient::BlockedCall_&> *)((long)pvVar2 + 0x3f0);
  *(void **)((long)pvVar2 + 0x200) = pvVar2;
  *(long *)this = (long)pvVar2 + 0x1f8;
  return (Own<kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }